

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

void __thiscall
fmt::v6::internal::float_writer<wchar_t>::float_writer
          (float_writer<wchar_t> *this,char *digits,int num_digits,int exp,float_specs specs,
          wchar_t decimal_point)

{
  int iVar1;
  counting_iterator cVar2;
  int iVar3;
  
  iVar3 = specs.precision;
  this->digits_ = digits;
  this->num_digits_ = num_digits;
  this->exp_ = exp;
  (this->specs_).precision = iVar3;
  *(uint *)&(this->specs_).field_0x4 = specs._4_4_;
  this->decimal_point_ = decimal_point;
  if (specs._4_1_ == '\0') {
    iVar1 = 0x10;
    if (0 < iVar3) {
      iVar1 = iVar3;
    }
    if ((exp + num_digits < -3) || (iVar1 < exp + num_digits)) {
      *(uint *)&(this->specs_).field_0x4 = specs._4_4_ | 1;
    }
  }
  cVar2 = prettify<fmt::v6::internal::counting_iterator>(this,(counting_iterator)0x0);
  this->size_ = (cVar2.count_ + 1) - (ulong)(((ulong)specs >> 0x20 & 0xff00) == 0);
  return;
}

Assistant:

float_writer(const char* digits, int num_digits, int exp, float_specs specs,
               Char decimal_point)
      : digits_(digits),
        num_digits_(num_digits),
        exp_(exp),
        specs_(specs),
        decimal_point_(decimal_point) {
    int full_exp = num_digits + exp - 1;
    int precision = specs.precision > 0 ? specs.precision : 16;
    if (specs_.format == float_format::general &&
        !(full_exp >= -4 && full_exp < precision)) {
      specs_.format = float_format::exp;
    }
    size_ = prettify(counting_iterator()).count();
    size_ += specs.sign ? 1 : 0;
  }